

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cpp
# Opt level: O1

IdentPtr __thiscall HashTbl::PidFromTk(HashTbl *this,tokens token)

{
  StaticSym *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  IdentPtr this_00;
  
  if (0x4c < token - tkABSTRACT) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.cpp"
                       ,0xdb,"(token > tkNone && token < tkID)","token > tkNone && token < tkID");
    if (!bVar3) goto LAB_00e761b1;
    *puVar4 = 0;
  }
  this_00 = this->m_rpid[token];
  if (this_00 == (IdentPtr)0x0) {
    pSVar1 = s_reservedWordInfo[token].sym;
    if (pSVar1 == (StaticSym *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.cpp"
                         ,0xe2,"(sym != nullptr)","sym != nullptr");
      if (!bVar3) {
LAB_00e761b1:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    this_00 = PidHashNameLenWithHash<char16_t>
                        (this,(char16_t *)(pSVar1 + 1),
                         (char16_t *)((long)&pSVar1[1].luHash + (ulong)pSVar1->cch * 2),pSVar1->cch,
                         pSVar1->luHash);
    Ident::SetTk(this_00,token,s_reservedWordInfo[token].grfid);
    this->m_rpid[token] = this_00;
  }
  return this_00;
}

Assistant:

IdentPtr HashTbl::PidFromTk(tokens token)
{
    Assert(token > tkNone && token < tkID);
    __analysis_assume(token > tkNone && token < tkID);
    // Create a pid so we can create a name node
    IdentPtr rpid = m_rpid[token];
    if (nullptr == rpid)
    {
        StaticSym const * sym = s_reservedWordInfo[token].sym;
        Assert(sym != nullptr);
        rpid = this->PidHashNameLenWithHash(sym->sz, sym->sz + sym->cch, sym->cch, sym->luHash);
        rpid->SetTk(token, s_reservedWordInfo[token].grfid);
        m_rpid[token] = rpid;
    }
    return rpid;
}